

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::Compiler::Impl::getAllSourceInfo
          (Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_>
           *__return_storage_ptr__,Impl *this,Orphanage orphanage)

{
  ElementCount index;
  _Hash_node_base *p_Var1;
  BuilderFor<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_> builder;
  ListBuilder local_78;
  StructBuilder local_50;
  
  capnp::_::OrphanBuilder::initStructList
            ((OrphanBuilder *)&local_50,orphanage.arena,orphanage.capTable,
             (ElementCount)(this->sourceInfoById)._M_h._M_element_count,(StructSize)0x20002);
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)local_50.capTable;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_50.data;
  (__return_storage_ptr__->builder).location = (word *)local_50.pointers;
  (__return_storage_ptr__->builder).tag.content = (uint64_t)local_50.segment;
  capnp::_::OrphanBuilder::asStructList
            (&local_78,&__return_storage_ptr__->builder,(StructSize)0x20002);
  p_Var1 = (this->sourceInfoById)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    index = 0;
    do {
      capnp::_::ListBuilder::getStructElement(&local_50,&local_78,index);
      capnp::_::StructBuilder::copyContentFrom(&local_50,*(StructReader *)(p_Var1 + 2));
      index = index + 1;
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Node::SourceInfo>> Compiler::Impl::getAllSourceInfo(Orphanage orphanage) {
  auto result = orphanage.newOrphan<List<schema::Node::SourceInfo>>(sourceInfoById.size());

  auto builder = result.get();
  size_t i = 0;
  for (auto& entry: sourceInfoById) {
    builder.setWithCaveats(i++, entry.second);
  }

  return result;
}